

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
* __thiscall
capnp::compiler::Compiler::Node::resolveMember
          (Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
           *__return_storage_ptr__,Node *this,StringPtr name)

{
  bool bVar1;
  Content *pCVar2;
  pointer ppVar3;
  pointer ppVar4;
  Alias *this_00;
  _Self local_138;
  _Self local_130;
  iterator iter_1;
  ResolvedDecl local_118;
  undefined1 local_b8 [8];
  ResolveResult result;
  Node *node;
  _Self local_40;
  iterator iter;
  Content *content;
  Node *this_local;
  StringPtr name_local;
  
  name_local.content.ptr = (char *)name.content.size_;
  this_local = (Node *)name.content.ptr;
  name_local.content.size_ = (size_t)__return_storage_ptr__;
  if ((this->isBuiltin & 1U) != 0) {
    kj::
    Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
    ::Maybe(__return_storage_ptr__,(void *)0x0);
    return __return_storage_ptr__;
  }
  iter._M_node = (_Base_ptr)getContent(this,EXPANDED);
  pCVar2 = kj::_::readMaybe<capnp::compiler::Compiler::Node::Content>
                     ((Maybe<capnp::compiler::Compiler::Node::Content_&> *)&iter);
  if (pCVar2 != (Content *)0x0) {
    local_40._M_node =
         (_Base_ptr)
         std::
         multimap<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node>_>_>_>
         ::find(&pCVar2->nestedNodes,(key_type *)&this_local);
    node = (Node *)std::
                   multimap<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node>_>_>_>
                   ::end(&pCVar2->nestedNodes);
    bVar1 = std::operator!=(&local_40,(_Self *)&node);
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node>_>_>
               ::operator->(&local_40);
      result.field_1._88_8_ = kj::Own::operator_cast_to_Node_((Own *)&ppVar3->second);
      kj::
      OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
      ::OneOf((OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
               *)local_b8);
      local_118.id = *(uint64_t *)(result.field_1._88_8_ + 0x48);
      local_118.genericParamCount = *(uint *)(result.field_1._88_8_ + 100);
      local_118.scopeId = this->id;
      local_118.kind = *(Which *)(result.field_1._88_8_ + 0x60);
      local_118.resolver = (Resolver *)result.field_1._88_8_;
      kj::Maybe<capnp::schema::Brand::Reader>::Maybe(&local_118.brand,(void *)0x0);
      kj::
      OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
      ::
      init<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>
                ((OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
                  *)local_b8,&local_118);
      NodeTranslator::Resolver::ResolvedDecl::~ResolvedDecl(&local_118);
      kj::
      Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
      ::Maybe(__return_storage_ptr__,
              (OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
               *)local_b8);
      kj::
      OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
      ::~OneOf((OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
                *)local_b8);
      return __return_storage_ptr__;
    }
    local_130._M_node =
         (_Base_ptr)
         std::
         multimap<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>_>_>_>
         ::find(&pCVar2->aliases,(key_type *)&this_local);
    local_138._M_node =
         (_Base_ptr)
         std::
         multimap<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>_>_>_>
         ::end(&pCVar2->aliases);
    bVar1 = std::operator!=(&local_130,&local_138);
    if (bVar1) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>_>_>
               ::operator->(&local_130);
      this_00 = kj::Own<capnp::compiler::Compiler::Alias>::operator->(&ppVar4->second);
      Alias::compile(__return_storage_ptr__,this_00);
      return __return_storage_ptr__;
    }
  }
  kj::
  Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  ::Maybe(__return_storage_ptr__,(void *)0x0);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<NodeTranslator::Resolver::ResolveResult>
Compiler::Node::resolveMember(kj::StringPtr name) {
  if (isBuiltin) return nullptr;

  KJ_IF_MAYBE(content, getContent(Content::EXPANDED)) {
    {
      auto iter = content->nestedNodes.find(name);
      if (iter != content->nestedNodes.end()) {
        Node* node = iter->second;
        ResolveResult result;
        result.init<ResolvedDecl>(ResolvedDecl {
            node->id, node->genericParamCount, id, node->kind, node, nullptr });
        return result;
      }
    }
    {
      auto iter = content->aliases.find(name);
      if (iter != content->aliases.end()) {
        return iter->second->compile();
      }
    }
  }
  return nullptr;
}